

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_entityx::ComponentHandle<Tag,_entityx::EntityManager>_&,_const_entityx::ComponentHandle<Tag,_entityx::EntityManager>_&>
::streamReconstructedExpression
          (BinaryExpr<const_entityx::ComponentHandle<Tag,_entityx::EntityManager>_&,_const_entityx::ComponentHandle<Tag,_entityx::EntityManager>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  ComponentHandle<Tag,_entityx::EntityManager> *in_RDX;
  ComponentHandle<Tag,_entityx::EntityManager> *value;
  string *in_R9;
  StringRef op;
  type local_60;
  type local_40;
  
  StringMaker<entityx::ComponentHandle<Tag,entityx::EntityManager>,void>::
  convert<entityx::ComponentHandle<Tag,entityx::EntityManager>>
            (&local_40,
             (StringMaker<entityx::ComponentHandle<Tag,entityx::EntityManager>,void> *)this->m_lhs,
             in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<entityx::ComponentHandle<Tag,entityx::EntityManager>,void>::
  convert<entityx::ComponentHandle<Tag,entityx::EntityManager>>
            (&local_60,
             (StringMaker<entityx::ComponentHandle<Tag,entityx::EntityManager>,void> *)this->m_rhs,
             value);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }